

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::internal::KeyMapBase<bool>::erase_no_destroy
          (KeyMapBase<bool> *this,map_index_t b,KeyNode *node)

{
  bool bVar1;
  LogMessage *pLVar2;
  NodeBase *pNVar3;
  TableEntryPtr TVar4;
  iterator tree_it_00;
  bool local_81;
  NodeBase *head;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  LogMessageFatal local_48 [22];
  Voidify local_32;
  undefined1 local_31;
  undefined1 auStack_30 [7];
  bool is_list;
  TreeIterator tree_it;
  KeyNode *node_local;
  KeyMapBase<bool> *pKStack_10;
  map_index_t b_local;
  KeyMapBase<bool> *this_local;
  
  tree_it._8_8_ = node;
  node_local._4_4_ = b;
  pKStack_10 = this;
  absl::lts_20240722::container_internal::
  btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
  ::btree_iterator((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
                    *)auStack_30);
  local_31 = revalidate_if_necessary
                       (this,(map_index_t *)((long)&node_local + 4),(KeyNode *)tree_it._8_8_,
                        (TreeIterator *)auStack_30);
  if ((bool)local_31) {
    bVar1 = UntypedMapBase::TableEntryIsNonEmptyList(&this->super_UntypedMapBase,node_local._4_4_);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_58,"TableEntryIsNonEmptyList(b)");
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/map.h"
                 ,0x3bc,local_58._M_len,local_58._M_str);
      pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_48);
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_32,pLVar2);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_48);
    }
    pNVar3 = TableEntryToNode((this->super_UntypedMapBase).table_[node_local._4_4_]);
    pNVar3 = EraseFromLinkedList((NodeBase *)tree_it._8_8_,pNVar3);
    TVar4 = NodeToTableEntry(pNVar3);
    (this->super_UntypedMapBase).table_[node_local._4_4_] = TVar4;
  }
  else {
    tree_it_00.position_ = tree_it.node_._0_4_;
    tree_it_00.node_ =
         (btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
          *)_auStack_30;
    tree_it_00._12_4_ = 0;
    UntypedMapBase::EraseFromTree(&this->super_UntypedMapBase,node_local._4_4_,tree_it_00);
  }
  (this->super_UntypedMapBase).num_elements_ = (this->super_UntypedMapBase).num_elements_ - 1;
  if (node_local._4_4_ == (this->super_UntypedMapBase).index_of_first_non_null_) {
    while( true ) {
      local_81 = false;
      if ((this->super_UntypedMapBase).index_of_first_non_null_ <
          (this->super_UntypedMapBase).num_buckets_) {
        local_81 = UntypedMapBase::TableEntryIsEmpty
                             (&this->super_UntypedMapBase,
                              (this->super_UntypedMapBase).index_of_first_non_null_);
      }
      if (local_81 == false) break;
      (this->super_UntypedMapBase).index_of_first_non_null_ =
           (this->super_UntypedMapBase).index_of_first_non_null_ + 1;
    }
  }
  return;
}

Assistant:

PROTOBUF_NOINLINE void erase_no_destroy(map_index_t b, KeyNode* node) {
    TreeIterator tree_it;
    const bool is_list = revalidate_if_necessary(b, node, &tree_it);
    if (is_list) {
      ABSL_DCHECK(TableEntryIsNonEmptyList(b));
      auto* head = TableEntryToNode(table_[b]);
      head = EraseFromLinkedList(node, head);
      table_[b] = NodeToTableEntry(head);
    } else {
      EraseFromTree(b, tree_it);
    }
    --num_elements_;
    if (PROTOBUF_PREDICT_FALSE(b == index_of_first_non_null_)) {
      while (index_of_first_non_null_ < num_buckets_ &&
             TableEntryIsEmpty(index_of_first_non_null_)) {
        ++index_of_first_non_null_;
      }
    }
  }